

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O2

string * __thiscall
cmSourceFile::GetLanguage_abi_cxx11_(string *__return_storage_ptr__,cmSourceFile *this)

{
  cmValue cVar1;
  cmValue cVar2;
  
  cVar1 = GetProperty(this,&propLANGUAGE_abi_cxx11_);
  cVar2.Value = &this->Language;
  if (cVar1.Value != (string *)0x0) {
    cVar2 = cVar1;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)cVar2.Value);
  return __return_storage_ptr__;
}

Assistant:

std::string cmSourceFile::GetLanguage() const
{
  // If the language was set explicitly by the user then use it.
  if (cmValue lang = this->GetProperty(propLANGUAGE)) {
    return *lang;
  }

  // Use the language determined from the file extension.
  return this->Language;
}